

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

bool __thiscall
crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::grant_ownership
          (vector<crnlib::color_quad<unsigned_char,_int>_> *this,color_quad<unsigned_char,_int> *p,
          uint size,uint capacity)

{
  uint capacity_local;
  uint size_local;
  color_quad<unsigned_char,_int> *p_local;
  vector<crnlib::color_quad<unsigned_char,_int>_> *this_local;
  
  if ((this->m_p < p + capacity) && (p < this->m_p + this->m_capacity)) {
    this_local._7_1_ = false;
  }
  else if (capacity < size) {
    this_local._7_1_ = false;
  }
  else {
    if (p == (color_quad<unsigned_char,_int> *)0x0) {
      if (capacity != 0) {
        return false;
      }
    }
    else if (capacity == 0) {
      return false;
    }
    clear(this);
    this->m_p = p;
    this->m_size = size;
    this->m_capacity = capacity;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

inline bool grant_ownership(T* p, uint size, uint capacity)
        {
            // To to prevent the caller from obviously shooting themselves in the foot.
            if (((p + capacity) > m_p) && (p < (m_p + m_capacity)))
            {
                // Can grant ownership of a block inside the container itself!
                CRNLIB_ASSERT(0);
                return false;
            }

            if (size > capacity)
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            if (!p)
            {
                if (capacity)
                {
                    CRNLIB_ASSERT(0);
                    return false;
                }
            }
            else if (!capacity)
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            clear();
            m_p = p;
            m_size = size;
            m_capacity = capacity;
            return true;
        }